

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  int *pnList;
  u8 uVar1;
  Fts3Expr *pFVar2;
  Fts3Expr *pFVar3;
  bool bVar4;
  u8 uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char *__dest;
  ulong uVar9;
  int iVar10;
  long lVar11;
  TokenDoclist *p;
  char **ppcVar12;
  long lVar13;
  Fts3Expr *pFVar14;
  Fts3Table *pFVar15;
  long lVar16;
  Fts3Phrase *pFVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  bool bVar21;
  char *pR;
  char *pL;
  TokenDoclist a [4];
  u8 local_119;
  Fts3Phrase *local_118;
  u8 local_109;
  int *local_108;
  Fts3Expr *local_100;
  ulong local_f8;
  u8 *local_f0;
  Fts3Table *local_e8;
  ulong local_e0;
  char *local_d8;
  Fts3Table *local_d0;
  char *local_c8 [2];
  TokenDoclist local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (*pRc != 0) {
    return;
  }
  uVar1 = pCsr->bDesc;
  pExpr->bStart = '\x01';
  local_100 = pExpr;
  local_108 = pRc;
  switch(pExpr->eType) {
  case 1:
  case 3:
    pFVar2 = pExpr->pLeft;
    pFVar3 = pExpr->pRight;
    if (pFVar2->bDeferred == '\0') {
      uVar5 = pFVar3->bDeferred;
      fts3EvalNextRow(pCsr,pFVar2,pRc);
      pFVar14 = pFVar3;
      if (uVar5 == '\0') {
        while (fts3EvalNextRow(pCsr,pFVar14,local_108), pFVar2->bEof == '\0') {
          uVar5 = pFVar3->bEof;
          if (uVar5 != '\0') {
            lVar11 = pFVar2->iDocid;
LAB_0017ff2e:
            local_100->iDocid = lVar11;
            bVar21 = uVar5 != '\0';
            goto LAB_0017ff3c;
          }
          lVar11 = pFVar2->iDocid;
          if (*local_108 != 0) goto LAB_0017ff2e;
          lVar16 = lVar11 - pFVar3->iDocid;
          lVar19 = -lVar16;
          if (uVar1 == '\0') {
            lVar19 = lVar16;
          }
          if (lVar19 == 0) goto LAB_0017ff2e;
          pFVar14 = pFVar2;
          if (-1 < lVar19) {
            pFVar14 = pFVar3;
          }
        }
        local_100->iDocid = pFVar2->iDocid;
        bVar21 = true;
LAB_0017ff3c:
        local_100->bEof = bVar21;
        if ((local_100->eType == 1) && (bVar21 != false)) {
          pFVar17 = pFVar3->pPhrase;
          if ((pFVar17 != (Fts3Phrase *)0x0) && ((pFVar17->doclist).aAll != (char *)0x0)) {
            while ((*local_108 == 0 && (pFVar3->bEof == '\0'))) {
              memset((pFVar17->doclist).pList,0,(long)(pFVar17->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar3,local_108);
            }
          }
          pFVar17 = pFVar2->pPhrase;
          if ((pFVar17 != (Fts3Phrase *)0x0) && ((pFVar17->doclist).aAll != (char *)0x0)) {
            iVar7 = *local_108;
            while ((iVar7 == 0 && (pFVar2->bEof == '\0'))) {
              memset((pFVar17->doclist).pList,0,(long)(pFVar17->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar2,local_108);
              iVar7 = *local_108;
            }
          }
        }
      }
      else {
        local_100->iDocid = pFVar2->iDocid;
        local_100->bEof = pFVar2->bEof;
      }
    }
    else {
      fts3EvalNextRow(pCsr,pFVar3,pRc);
      pExpr->iDocid = pFVar3->iDocid;
      pExpr->bEof = pFVar3->bEof;
    }
    break;
  case 2:
    pFVar2 = pExpr->pLeft;
    pFVar3 = pExpr->pRight;
    if (pFVar3->bStart == '\0') {
      fts3EvalNextRow(pCsr,pFVar3,pRc);
    }
    fts3EvalNextRow(pCsr,pFVar2,pRc);
    uVar5 = pFVar2->bEof;
    if (uVar5 == '\0') {
      if (*pRc == 0) {
        while (pFVar3->bEof == '\0') {
          lVar19 = pFVar2->iDocid - pFVar3->iDocid;
          lVar11 = -lVar19;
          if (uVar1 == '\0') {
            lVar11 = lVar19;
          }
          if ((lVar11 < 1) || (fts3EvalNextRow(pCsr,pFVar3,pRc), *pRc != 0)) break;
        }
        uVar5 = pFVar2->bEof;
      }
      else {
        uVar5 = '\0';
      }
    }
    pExpr->iDocid = pFVar2->iDocid;
    pExpr->bEof = uVar5;
    break;
  case 4:
    pFVar2 = pExpr->pLeft;
    pFVar3 = pExpr->pRight;
    uVar18 = -(ulong)(uVar1 != '\0') | 1;
    pFVar14 = pFVar2;
    if (pFVar3->bEof == '\0') {
      lVar11 = (pFVar2->iDocid - pFVar3->iDocid) * uVar18;
      if ((((pFVar2->bEof != '\0') || (-1 < lVar11)) && (pFVar14 = pFVar3, pFVar2->bEof == '\0')) &&
         (lVar11 < 1)) {
        fts3EvalNextRow(pCsr,pFVar2,pRc);
      }
    }
    fts3EvalNextRow(pCsr,pFVar14,pRc);
    if (pFVar2->bEof == '\0') {
      bVar21 = false;
    }
    else {
      bVar21 = pFVar3->bEof != '\0';
    }
    pExpr->bEof = bVar21;
    lVar11 = pFVar2->iDocid;
    if ((pFVar3->bEof == '\0') &&
       ((pFVar2->bEof != '\0' || (-1 < (long)((lVar11 - pFVar3->iDocid) * uVar18))))) {
      pExpr->iDocid = pFVar3->iDocid;
      return;
    }
    goto LAB_0017ff0f;
  default:
    local_118 = pExpr->pPhrase;
    if ((local_118->doclist).bFreeList != 0) {
      sqlite3_free((local_118->doclist).pList);
    }
    (local_118->doclist).pList = (char *)0x0;
    pnList = &(local_118->doclist).nList;
    (local_118->doclist).nList = 0;
    (local_118->doclist).bFreeList = 0;
    local_f0 = &pExpr->bEof;
    local_e8 = (Fts3Table *)(pCsr->base).pVtab;
    if (local_118->bIncr != 0) {
      local_119 = '\0';
      if (local_118->nToken != 1) {
        local_109 = pCsr->bDesc;
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98 = 0;
        uStack_90 = 0;
        local_b8.pList = (char *)0x0;
        local_b8.nList = 0;
        local_b8._28_4_ = 0;
        local_b8.bIgnore = 0;
        local_b8._4_4_ = 0;
        local_b8.iDocid = 0;
        local_e0 = -(ulong)(local_109 != '\0') | 1;
        uVar18 = 0;
        pFVar15 = (Fts3Table *)0x0;
        do {
          p = &local_b8;
          if ((int)uVar18 == 0) {
            uVar18 = 0;
            lVar19 = 0;
            bVar21 = false;
            lVar11 = 0;
            do {
              pFVar15 = (Fts3Table *)CONCAT71((int7)((ulong)pFVar15 >> 8),local_119);
              lVar16 = lVar11;
              if ((local_118->nToken <= lVar19) || (local_119 != '\0')) goto LAB_0017fbc1;
              pFVar15 = local_e8;
              uVar6 = incrPhraseTokenNext(local_e8,local_118,(int)lVar19,p,&local_119);
              bVar4 = bVar21;
              if (p->bIgnore == 0) {
                lVar16 = p->iDocid;
                bVar4 = true;
                if (bVar21) {
                  lVar13 = -(lVar11 - lVar16);
                  if (local_109 == '\0') {
                    lVar13 = lVar11 - lVar16;
                  }
                  if (-1 < lVar13) {
                    lVar16 = lVar11;
                  }
                }
              }
              bVar21 = bVar4;
              lVar19 = lVar19 + 1;
              p = p + 1;
              lVar11 = lVar16;
            } while (uVar6 == 0);
            pFVar15 = (Fts3Table *)CONCAT71((int7)((ulong)pFVar15 >> 8),local_119);
            uVar18 = (ulong)uVar6;
          }
          else {
            lVar16 = 0;
          }
LAB_0017fbc1:
          iVar7 = local_118->nToken;
          pFVar17 = local_118;
          if (0 < iVar7) {
            iVar10 = 0;
            uVar9 = (ulong)pFVar15 & 0xffffffff;
            do {
              if (((int)uVar18 == 0) && ((char)uVar9 == '\0')) {
                lVar11 = (long)iVar10;
                uVar9 = 0;
                if ((&local_b8)[lVar11].bIgnore == 0) {
                  uVar9 = 0;
                  uVar18 = 0;
                  lVar19 = lVar16;
                  if ((long)(((&local_b8)[lVar11].iDocid - lVar16) * local_e0) < 0) {
                    do {
                      pFVar15 = local_e8;
                      uVar6 = incrPhraseTokenNext(local_e8,pFVar17,iVar10,&local_b8 + lVar11,
                                                  &local_119);
                      uVar18 = (ulong)uVar6;
                      lVar16 = (&local_b8)[lVar11].iDocid;
                      iVar7 = 0;
                      if ((long)(((&local_b8)[lVar11].iDocid - lVar19) * local_e0) < 1) {
                        lVar16 = lVar19;
                        iVar7 = iVar10;
                      }
                      iVar10 = iVar7;
                      pFVar15 = (Fts3Table *)CONCAT71((int7)((ulong)pFVar15 >> 8),local_119);
                      pFVar17 = local_118;
                      if ((uVar6 != 0) || (local_119 != '\0')) goto LAB_0017fcb0;
                      lVar11 = (long)iVar10;
                    } while (((&local_b8)[lVar11].bIgnore == 0) &&
                            (lVar19 = lVar16,
                            (long)(((&local_b8)[lVar11].iDocid - lVar16) * local_e0) < 0));
                    pFVar15 = (Fts3Table *)0x0;
LAB_0017fcb0:
                    iVar7 = local_118->nToken;
                    uVar9 = (ulong)pFVar15 & 0xffffffff;
                  }
                }
                else {
                  uVar18 = 0;
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < iVar7);
          }
          if ((char)pFVar15 != '\0') goto LAB_0017fef6;
          iVar7 = *(int *)(local_c8 + (long)iVar7 * 4U + 1);
          local_d0 = pFVar15;
          __dest = (char *)sqlite3_malloc((int)((long)iVar7 + 1U));
          pFVar17 = local_118;
          if (__dest == (char *)0x0) {
            iVar7 = 7;
            goto LAB_0017ff08;
          }
          local_f8 = uVar18;
          memcpy(__dest,local_c8[(long)local_118->nToken * 4],(long)iVar7 + 1U);
          iVar7 = pFVar17->nToken;
          lVar11 = 0;
          uVar18 = local_f8;
          if (iVar7 < 2) {
            iVar10 = 0;
          }
          else {
            lVar11 = 0;
            iVar20 = -1;
            ppcVar12 = &local_b8.pList;
            iVar10 = 0;
            do {
              if (((TokenDoclist *)(ppcVar12 + -2))->bIgnore == 0) {
                local_c8[1] = *ppcVar12;
                local_d8 = __dest;
                local_c8[0] = __dest;
                iVar8 = fts3PoslistPhraseMerge(&local_d8,iVar7 + iVar20,0,1,local_c8 + 1,local_c8);
                iVar7 = local_118->nToken;
                pFVar17 = local_118;
                uVar18 = local_f8;
                if (iVar8 == 0) break;
                iVar10 = (int)local_d8 - (int)__dest;
              }
              lVar11 = lVar11 + 1;
              iVar20 = iVar20 + -1;
              ppcVar12 = ppcVar12 + 4;
            } while (lVar11 < iVar7 + -1);
          }
          if ((int)lVar11 == iVar7 + -1) goto LAB_0017fee0;
          sqlite3_free(__dest);
          pFVar15 = local_d0;
        } while( true );
      }
      uVar6 = sqlite3Fts3MsrIncrNext
                        (local_e8,local_118->aToken[0].pSegcsr,&(local_118->doclist).iDocid,
                         &(local_118->doclist).pList,pnList);
      uVar18 = (ulong)uVar6;
      pFVar15 = (Fts3Table *)(ulong)((local_118->doclist).pList == (char *)0x0);
      pFVar17 = local_118;
      goto LAB_0017fef6;
    }
    if ((pCsr->bDesc == local_e8->bDescIdx) || (iVar7 = (local_118->doclist).nAll, iVar7 == 0)) {
      fts3EvalDlPhraseNext(local_e8,&local_118->doclist,local_f0);
    }
    else {
      sqlite3Fts3DoclistPrev
                ((uint)local_e8->bDescIdx,(local_118->doclist).aAll,iVar7,
                 &(local_118->doclist).pNextDocid,&(local_118->doclist).iDocid,pnList,local_f0);
      (local_118->doclist).pList = (local_118->doclist).pNextDocid;
    }
    iVar7 = 0;
    goto LAB_0017ff08;
  }
  return;
LAB_0017fee0:
  (pFVar17->doclist).iDocid = lVar16;
  (pFVar17->doclist).pList = __dest;
  (pFVar17->doclist).nList = iVar10;
  (pFVar17->doclist).bFreeList = 1;
  pFVar15 = (Fts3Table *)0x0;
LAB_0017fef6:
  iVar7 = (int)uVar18;
  *local_f0 = (u8)pFVar15;
  local_118 = pFVar17;
LAB_0017ff08:
  *local_108 = iVar7;
  lVar11 = (local_118->doclist).iDocid;
LAB_0017ff0f:
  local_100->iDocid = lVar11;
  return;
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    assert( pExpr->bEof==0 );
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            if( pRight->pPhrase && pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
          }
        }
        break;
      }
  
      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || (pRight->bEof==0 && iCmp>0) ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc 
              && !pRight->bEof 
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0 
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}